

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O3

bool __thiscall test_CECoordinates::test_copy(test_CECoordinates *this)

{
  CECoordinates *lhs;
  CECoordinates *rhs;
  bool bVar1;
  undefined1 uVar2;
  CECoordinates gal;
  CECoordinates cirs;
  CECoordinates icrs;
  CECoordinates obs;
  allocator local_115;
  undefined4 local_114;
  CECoordinates local_110;
  CECoordinates local_e0;
  undefined4 local_b0 [8];
  CECoordinates local_90;
  CECoordinates local_60;
  
  lhs = &this->base_icrs_;
  bVar1 = operator==(lhs,lhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"test_copy",(allocator *)&local_110);
  local_90._vptr_CECoordinates._0_4_ = 0x97;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_110);
  bVar1 = operator!=(lhs,lhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"test_copy",(allocator *)&local_110);
  local_90._vptr_CECoordinates._0_4_ = 0x98;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_110);
  rhs = &this->base_gal_;
  bVar1 = operator==(lhs,rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"test_copy",(allocator *)&local_110);
  local_90._vptr_CECoordinates._0_4_ = 0x99;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_110);
  bVar1 = operator!=(lhs,rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"test_copy",(allocator *)&local_110);
  local_90._vptr_CECoordinates._0_4_ = 0x9a;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_110);
  CECoordinates::CECoordinates(&local_e0,&this->base_cirs_);
  bVar1 = operator==(&local_e0,&this->base_cirs_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"test_copy",(allocator *)&local_60);
  local_110._vptr_CECoordinates._0_4_ = 0x9e;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_60);
  CECoordinates::CECoordinates(&local_90,lhs);
  bVar1 = operator==(&local_90,lhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"test_copy",(allocator *)local_b0);
  local_60._vptr_CECoordinates._0_4_ = 0xa2;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_b0);
  CECoordinates::CECoordinates(&local_110,rhs);
  bVar1 = operator==(&local_110,rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"test_copy",(allocator *)&local_114);
  local_b0[0] = 0xa6;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_114);
  CECoordinates::CECoordinates(&local_60,&this->base_obs_);
  bVar1 = operator==(&local_60,&this->base_obs_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"test_copy",&local_115);
  local_114 = 0xaa;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_115);
  CECoordinates::SetCoordinates(&local_110,&local_90);
  bVar1 = operator==(&local_110,&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"test_copy",&local_115);
  local_114 = 0xae;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_115);
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  CECoordinates::~CECoordinates(&local_60);
  CECoordinates::~CECoordinates(&local_110);
  CECoordinates::~CECoordinates(&local_90);
  CECoordinates::~CECoordinates(&local_e0);
  return (bool)uVar2;
}

Assistant:

bool test_CECoordinates::test_copy()
{
    // Make sure the equals and not-equals operators work properly
    test_bool((base_icrs_ == base_icrs_), true, __func__, __LINE__);
    test_bool((base_icrs_ != base_icrs_), false, __func__, __LINE__);
    test_bool((base_icrs_ == base_gal_), false, __func__, __LINE__);
    test_bool((base_icrs_ != base_gal_), true, __func__, __LINE__);

    // Copy CIRS
    CECoordinates cirs = base_cirs_;
    test((cirs == base_cirs_), __func__, __LINE__);

    // Copy ICRS
    CECoordinates icrs = base_icrs_;
    test((icrs == base_icrs_), __func__, __LINE__);

    // Copy Galactic
    CECoordinates gal = base_gal_;
    test((gal == base_gal_), __func__, __LINE__);

    // Copy Observed
    CECoordinates obs = base_obs_;
    test((obs == base_obs_), __func__, __LINE__);

    // Copy coordinates directly
    gal.SetCoordinates(icrs);
    test((gal == icrs), __func__, __LINE__);

    return pass();
}